

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_1.cpp
# Opt level: O2

int main(void)

{
  undefined8 in_RAX;
  ostream *poVar1;
  double *pdVar2;
  int j;
  ulong uVar3;
  int i;
  long lVar4;
  int N;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  __isoc99_scanf("%d",(long)&uStack_28 + 4);
  pdVar2 = num;
  for (lVar4 = 0; lVar4 < uStack_28._4_4_; lVar4 = lVar4 + 1) {
    __isoc99_scanf("%lf",pdVar2);
    pdVar2 = pdVar2 + 1;
  }
  pdVar2 = num;
  std::__sort<double*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(double,double)>>
            (num,num + uStack_28._4_4_,(_Iter_comp_iter<bool_(*)(double,_double)>)0x1011cc);
  for (uVar3 = 0; lVar4 = std::cout, (long)uVar3 < (long)uStack_28._4_4_; uVar3 = uVar3 + 1) {
    if (uVar3 == uStack_28._4_4_ - 1) {
      *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 6;
      std::ostream::_M_insert<double>(*pdVar2);
    }
    else {
      memmove[*(long *)(std::cout + -0x18)] =
           (code)((byte)memmove[*(long *)(std::cout + -0x18)] | 4);
      *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar4 + -0x18)) = 6;
      poVar1 = std::ostream::_M_insert<double>(*pdVar2);
      std::operator<<(poVar1," ");
    }
    pdVar2 = pdVar2 + 1;
  }
  return 0;
}

Assistant:

int main()
{
    int N;
    scanf("%d",&N);
    for (int i = 0; i < N; ++i) {
        scanf("%lf",&num[i]);

    }
    sort(num,num + N,cmp);
    for (int j = 0; j < N; ++j) {
        if(j != N - 1)
        {
            //printf("%.6lf ",num[j]);
            cout.setf(ios::fixed);          //fixed表示不带指数域，若要用指数域则使用scientific
            cout << setprecision(6) << num[j] << " ";
        }
        else
            //printf("%.6lf",num[j]);
            cout << setprecision(6) << num[j];
    }
    return 0;
}